

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall
QOpenGLTexture::generateMipMaps(QOpenGLTexture *this,int baseLevel,bool resetBaseLevel)

{
  bool bVar1;
  QOpenGLTexturePrivate *pQVar2;
  long lVar3;
  ulong uVar4;
  undefined1 in_DL;
  undefined4 in_ESI;
  QOpenGLTexture *in_RDI;
  int oldBaseLevel;
  QOpenGLContext *ctx;
  QOpenGLTexturePrivate *d;
  int baseLevel_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  undefined8 in_stack_ffffffffffffffe0;
  GLenum bindingTarget;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar6;
  
  bindingTarget = (GLenum)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  uVar6 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  pQVar2 = d_func((QOpenGLTexture *)0x18f168);
  bVar1 = isCompressedFormat(pQVar2->format);
  if (bVar1) {
    lVar3 = QOpenGLContext::currentContext();
    if ((lVar3 != 0) && (uVar4 = QOpenGLContext::isOpenGLES(), (uVar4 & 1) != 0)) {
      return;
    }
    bindingTarget = (GLenum)((ulong)lVar3 >> 0x20);
  }
  iVar5 = -0x55555556;
  if ((uVar6 & 0x1000000) != 0) {
    iVar5 = mipBaseLevel(in_RDI);
  }
  baseLevel_00 = (int)((ulong)in_RDI >> 0x20);
  setMipBaseLevel((QOpenGLTexture *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),baseLevel_00);
  QOpenGLTextureHelper::glGenerateTextureMipmap
            ((QOpenGLTextureHelper *)CONCAT44(in_ESI,uVar6),(GLuint)((ulong)pQVar2 >> 0x20),
             (GLenum)pQVar2,bindingTarget);
  if ((uVar6 & 0x1000000) != 0) {
    setMipBaseLevel((QOpenGLTexture *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),baseLevel_00);
  }
  return;
}

Assistant:

void QOpenGLTexture::generateMipMaps(int baseLevel, bool resetBaseLevel)
{
    Q_D(QOpenGLTexture);
    Q_ASSERT(d->texFuncs);
    Q_ASSERT(d->textureId);
    if (isCompressedFormat(d->format)) {
        if (QOpenGLContext *ctx = QOpenGLContext::currentContext())
            if (ctx->isOpenGLES())
                return;
    }
    int oldBaseLevel;
    if (resetBaseLevel)
        oldBaseLevel = mipBaseLevel();
    setMipBaseLevel(baseLevel);
    d->texFuncs->glGenerateTextureMipmap(d->textureId, d->target, d->bindingTarget);
    if (resetBaseLevel)
        setMipBaseLevel(oldBaseLevel);
}